

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEmbedTest.cpp
# Opt level: O2

int PDFEmbedTest(int argc,char **argv)

{
  EStatusCode EVar1;
  LogConfiguration *inLogConfiguration;
  EncryptionOptions *pEVar2;
  PDFParsingOptions *inParsingOptions;
  PDFPage *this;
  PageContentContext *inPageContext;
  ResourcesDictionary *pRVar3;
  uint uVar4;
  char *pcVar5;
  allocator<char> local_1002;
  allocator<char> local_1001;
  EStatusCodeAndObjectIDTypeList result;
  string local_fe0;
  string local_fc0;
  undefined1 local_fa0 [8];
  undefined1 local_f98 [80];
  bool local_f48;
  string local_f40;
  EncryptionOptions local_f20;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc0,"PDFEmbedTest.pdf",&local_1002);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fe0,argv[2],(allocator<char> *)&local_f40);
  LocalPathToFileURL((FileURL *)local_fa0,&local_fe0);
  RelativeURLToLocalPath((string *)&result,(FileURL *)local_fa0,&local_fc0);
  FileURL::~FileURL((FileURL *)local_fa0);
  std::__cxx11::string::~string((string *)&local_fe0);
  inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f20,pEVar2);
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)local_f98,&local_f20);
  local_fa0._0_2_ = 0x101;
  local_f48 = false;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,(string *)&result,ePDFVersion13,inLogConfiguration,
                              (PDFCreationSettings *)local_fa0);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)local_f98);
  EncryptionOptions::~EncryptionOptions(&local_f20);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_fc0);
  if (EVar1 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
    uVar4 = 1;
    goto LAB_0013c0c1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f40,"XObjectContent.pdf",&local_1001);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe0,argv[1],&local_1002);
  LocalPathToFileURL((FileURL *)local_fa0,&local_fe0);
  RelativeURLToLocalPath(&local_fc0,(FileURL *)local_fa0,&local_f40);
  FileURL::~FileURL((FileURL *)local_fa0);
  std::__cxx11::string::~string((string *)&local_fe0);
  local_f98._16_8_ = 0.0;
  local_fa0._0_4_ = eRangeTypeAll;
  local_fe0.field_2._M_allocated_capacity = 0;
  local_fe0._M_dataplus._M_p = (pointer)&local_fe0;
  local_fe0._M_string_length = (size_type)&local_fe0;
  local_f98._0_8_ = (EncryptionOptions *)local_f98;
  local_f98._8_8_ = (EncryptionOptions *)local_f98;
  inParsingOptions = PDFParsingOptions::DefaultPDFParsingOptions();
  PDFWriter::CreateFormXObjectsFromPDF
            (&result,&pdfWriter,&local_fc0,(PDFPageRange *)local_fa0,ePDFPageBoxMediaBox,
             (double *)0x0,(ObjectIDTypeList *)&local_fe0,inParsingOptions);
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_fe0);
  std::__cxx11::
  _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_clear((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)local_f98);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::__cxx11::string::~string((string *)&local_f40);
  if (result.first == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_fa0,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_fa0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_fa0);
    inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
    AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::cm
              (&inPageContext->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0);
    pRVar3 = PDFPage::GetResourcesDictionary(this);
    ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
              ((string *)local_fa0,pRVar3,
               (ObjectIDType)
               result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               ._M_node.super__List_node_base._M_next[1]._M_next);
    AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,(string *)local_fa0);
    std::__cxx11::string::~string((string *)local_fa0);
    AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::G(&inPageContext->super_AbstractContentContext,0.0);
    AbstractContentContext::w(&inPageContext->super_AbstractContentContext,1.0);
    AbstractContentContext::re(&inPageContext->super_AbstractContentContext,0.0,421.0,297.5,421.0);
    AbstractContentContext::S(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::cm
              (&inPageContext->super_AbstractContentContext,0.5,0.0,0.0,0.5,297.5,0.0);
    pRVar3 = PDFPage::GetResourcesDictionary(this);
    ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
              ((string *)local_fa0,pRVar3,
               (ObjectIDType)
               result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               ._M_node.super__List_node_base._M_prev[1]._M_next);
    AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,(string *)local_fa0);
    std::__cxx11::string::~string((string *)local_fa0);
    AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::G(&inPageContext->super_AbstractContentContext,0.0);
    AbstractContentContext::w(&inPageContext->super_AbstractContentContext,1.0);
    AbstractContentContext::re(&inPageContext->super_AbstractContentContext,297.5,0.0,297.5,421.0);
    AbstractContentContext::S(&inPageContext->super_AbstractContentContext);
    EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
    if (EVar1 == eSuccess) {
      EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
      if (EVar1 == eSuccess) {
        EVar1 = PDFWriter::EndPDF(&pdfWriter);
        if (EVar1 == eSuccess) {
          uVar4 = 0;
          goto LAB_0013c0b7;
        }
        pcVar5 = "failed in end PDF\n";
      }
      else {
        pcVar5 = "failed to write page\n";
      }
    }
    else {
      pcVar5 = "failed to end page content context\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar5);
    uVar4 = 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to create PDF XObjects from PDF file\n");
    uVar4 = (uint)(result.first != eSuccess);
  }
LAB_0013c0b7:
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_0013c0c1:
  PDFWriter::~PDFWriter(&pdfWriter);
  return uVar4;
}

Assistant:

int PDFEmbedTest(int argc, char* argv[])
{
	EStatusCode status;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"PDFEmbedTest.pdf"),ePDFVersion13);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		// Create XObjects from PDF to embed
		EStatusCodeAndObjectIDTypeList result = pdfWriter.CreateFormXObjectsFromPDF(
                                                        BuildRelativeInputPath(argv,"XObjectContent.pdf"),PDFPageRange(),ePDFPageBoxMediaBox);
		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to create PDF XObjects from PDF file\n";
			status = result.first;
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);

		// place the first page in the top left corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,0,421);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.front()));
		contentContext->Q();
		
		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(0,421,297.5,421);
		contentContext->S();


		// place the second page in the bottom right corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,297.5,0);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.back()));
		contentContext->Q();

		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(297.5,0,297.5,421);
		contentContext->S();


		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;
}